

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncharutils.h
# Opt level: O1

size_t codepoint_to_utf8(uint32_t cp,uint8_t *c)

{
  undefined1 auVar1 [16];
  byte bVar2;
  
  bVar2 = (byte)cp;
  if (cp < 0x80) {
    *c = bVar2;
    return 1;
  }
  if (cp < 0x800) {
    *c = (byte)(cp >> 6) | 0xc0;
    c[1] = bVar2 & 0x3f | 0x80;
    return 2;
  }
  if (cp < 0x10000) {
    *c = (byte)(cp >> 0xc) | 0xe0;
    c[1] = (byte)(cp >> 6) & 0x3f | 0x80;
    c[2] = bVar2 & 0x3f | 0x80;
    return 3;
  }
  if (cp < 0x110000) {
    auVar1 = vpinsrb_avx(ZEXT416(cp >> 0x12),cp >> 0xc & 0xffffff3f,1);
    auVar1 = vpinsrb_avx(auVar1,cp >> 6 & 0xffffff3f,2);
    auVar1 = vpinsrb_avx(auVar1,cp & 0xffffff3f,3);
    auVar1 = vpor_avx(auVar1,_DAT_0018b2a0);
    *(int *)c = auVar1._0_4_;
    return 4;
  }
  return 0;
}

Assistant:

inline size_t codepoint_to_utf8(uint32_t cp, uint8_t *c) {
  if (cp <= 0x7F) {
    c[0] = cp;
    return 1; // ascii
  } if (cp <= 0x7FF) {
    c[0] = (cp >> 6) + 192;
    c[1] = (cp & 63) + 128;
    return 2; // universal plane
  //  Surrogates are treated elsewhere...
  //} //else if (0xd800 <= cp && cp <= 0xdfff) {
  //  return 0; // surrogates // could put assert here
  } else if (cp <= 0xFFFF) {
    c[0] = (cp >> 12) + 224;
    c[1] = ((cp >> 6) & 63) + 128;
    c[2] = (cp & 63) + 128;
    return 3;
  } else if (cp <= 0x10FFFF) { // if you know you have a valid code point, this is not needed
    c[0] = (cp >> 18) + 240;
    c[1] = ((cp >> 12) & 63) + 128;
    c[2] = ((cp >> 6) & 63) + 128;
    c[3] = (cp & 63) + 128;
    return 4;
  }
  // will return 0 when the code point was too large.
  return 0; // bad r
}